

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

int prototypeArgument(int parBlkSize)

{
  object *poVar1;
  int *piVar2;
  object *poVar3;
  typeDesc *ptVar4;
  typeDesc *ptVar5;
  object *poVar6;
  int iVar7;
  char *msg;
  
  if (currentSymbol < 0x268) {
    if (currentSymbol == 0x25f) {
      piVar2 = &intTypeIndex;
    }
    else {
      if (currentSymbol != 0x261) {
LAB_0010613f:
        msg = "bad argument";
        goto LAB_00106158;
      }
      piVar2 = &charTypeIndex;
    }
  }
  else {
    if (currentSymbol == 0x268) {
      getSymbol();
      if (currentSymbol == 0x1f5) {
        getSymbol();
        poVar3 = find();
        ptVar4 = getType(poVar3->typeIndex);
        if (currentSymbol == 99) {
          getSymbol();
          poVar1 = guard;
          poVar3 = topScope;
          if (currentSymbol == 0x1f5) {
            poVar3 = newObj(0x2c5);
            getSymbol();
          }
          else {
            do {
              poVar6 = poVar3;
              poVar3 = poVar6->next;
            } while (poVar3 != guard);
            poVar3 = (object *)calloc(1,0x90);
            poVar3->cl = 0x2c5;
            poVar3->next = poVar1;
            poVar6->next = poVar3;
          }
          poVar3->typeIndex = ptVar4->refIndex;
          return parBlkSize + 4;
        }
        msg = "bad struct variable";
      }
      else {
        msg = "missing struct qualifier";
      }
      goto LAB_00106158;
    }
    if (currentSymbol != 0x26d) goto LAB_0010613f;
    piVar2 = &boolTypeIndex;
  }
  iVar7 = *piVar2;
  getSymbol();
  poVar1 = guard;
  poVar3 = topScope;
  if (currentSymbol == 0x1f5) {
    poVar3 = newObj(0x2c1);
    getSymbol();
  }
  else {
    do {
      poVar6 = poVar3;
      poVar3 = poVar6->next;
    } while (poVar3 != guard);
    poVar3 = (object *)calloc(1,0x90);
    poVar3->cl = 0x2c1;
    poVar3->next = poVar1;
    poVar6->next = poVar3;
  }
  poVar3->typeIndex = iVar7;
  ptVar4 = getType(iVar7);
  if (currentSymbol == 0x130) {
    getSymbol();
    if (currentSymbol != 0x12f) {
      msg = "missing right bracket";
LAB_00106158:
      mark(msg);
      exit(-1);
    }
    ptVar4 = newType();
    ptVar4->form = 0x322;
    ptVar5 = getType(iVar7);
    ptVar4->base = ptVar5;
    ptVar4->size = 0xc;
    poVar3->typeIndex = ptVar4->index;
    poVar3->cl = 0x2c5;
    iVar7 = parBlkSize + 0xc;
    getSymbol();
  }
  else {
    iVar7 = parBlkSize + ptVar4->size;
  }
  return iVar7;
}

Assistant:

procedure 
int prototypeArgument(int parBlkSize)  {
	variable struct object *obj;
	variable struct typeDesc *type; variable struct typeDesc *tp;
	variable int tpIndex; variable int parSize;
	obj = NULL; tp = NULL; type = NULL; parSize = 0;tpIndex=0;

	if ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR) || (currentSymbol == SYMBOL_BOOL)) { /* int, char, bool */
		if (currentSymbol == SYMBOL_INT){
			tpIndex = intTypeIndex;
		} elsif (currentSymbol == SYMBOL_CHAR){
			tpIndex = charTypeIndex;
		} elsif (currentSymbol == SYMBOL_BOOL) {
			tpIndex = boolTypeIndex;
		}
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			obj = newObj(CLASS_VAR);
			getSymbol();
		} else {
			obj = newAnonymousObj(CLASS_VAR); 
		}
		obj->typeIndex = tpIndex;
		type = getType(tpIndex);
		parSize = parBlkSize + type->size;
		if (currentSymbol == SYMBOL_LBRAK) { /* char [] */
			getSymbol();
			if (currentSymbol == SYMBOL_RBRAK) { 
				tp = newType();
				tp->form = FORM_ARRAY;
				type = getType(tpIndex);
				tp->base = type;
				tp->size = wordSize + 8; 
				obj->typeIndex = tp->index;
				obj->cl = CLASS_PAR; 
				parSize = parBlkSize + wordSize + 8; 
				getSymbol();
			} else {
				mark("missing right bracket");
				exit(-1);
			}
		}	
	} elsif (currentSymbol == SYMBOL_STRUCT) { 
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			getSymbol();
			obj = find();
			type = getType(obj->typeIndex);
			if (currentSymbol == SYMBOL_MUL) {
				getSymbol();
				if (currentSymbol == SYMBOL_IDENTIFIER) {
					obj = newObj(CLASS_PAR);
					getSymbol();
				} else {
					obj = newAnonymousObj(CLASS_PAR);
				}
				obj->typeIndex = type->refIndex;
				parSize = parBlkSize + wordSize;
			} else {
				mark("bad struct variable");
				exit(-1);
			}
		} else {
			mark("missing struct qualifier");
			exit(-1);
		}
	} else {
		mark("bad argument");
		exit(-1);
	}
	return parSize;
}